

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::SetGlyphVisible(ImFont *this,ImWchar c,bool visible)

{
  ushort uVar1;
  ImFontGlyph *pIVar2;
  undefined2 in_register_00000032;
  
  if (((ulong)CONCAT22(in_register_00000032,c) < (ulong)(long)(this->IndexLookup).Size) &&
     (uVar1 = (this->IndexLookup).Data[CONCAT22(in_register_00000032,c)], uVar1 != 0xffff)) {
    pIVar2 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
  }
  else {
    pIVar2 = this->FallbackGlyph;
  }
  if (pIVar2 != (ImFontGlyph *)0x0) {
    *(uint *)pIVar2 = *(uint *)pIVar2 & 0x7fffffff | (uint)visible << 0x1f;
  }
  return;
}

Assistant:

const ImFontGlyph* ImFont::FindGlyph(ImWchar c) const
{
    if (c >= (size_t)IndexLookup.Size)
        return FallbackGlyph;
    const ImWchar i = IndexLookup.Data[c];
    if (i == (ImWchar)-1)
        return FallbackGlyph;
    return &Glyphs.Data[i];
}